

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O2

void __thiscall
duckdb::CommonAggregateOptimizer::ExtractCommonAggregates
          (CommonAggregateOptimizer *this,LogicalAggregate *aggr)

{
  type pEVar1;
  idx_t iVar2;
  reference pvVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong __n;
  long lVar7;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  ColumnBinding original_binding;
  expression_map_t<idx_t> aggregate_remap;
  key_type local_88;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_78;
  _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_70;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(aggr->super_LogicalOperator).expressions;
  local_70 = (_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->aggregate_map;
  lVar7 = 0;
  local_78 = this_00;
  for (__n = 0; __n < (ulong)((long)(aggr->super_LogicalOperator).expressions.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(aggr->super_LogicalOperator).expressions.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_00,__n);
    local_88.table_index =
         (idx_t)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar3);
    iVar4 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_68,(key_type *)&local_88);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,__n);
      local_88.table_index =
           (idx_t)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(pvVar3);
      pmVar6 = ::std::__detail::
               _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)&local_88);
      *pmVar6 = __n;
      if (lVar7 == 0) {
        lVar7 = 0;
      }
      else {
        pEVar1 = (type)aggr->aggregate_index;
        local_88.table_index = (idx_t)pEVar1;
        local_88.column_index = lVar7 + __n;
        pmVar5 = ::std::__detail::
                 _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_70,&local_88);
        pmVar5->table_index = (idx_t)pEVar1;
        pmVar5->column_index = __n;
        this_00 = local_78;
      }
    }
    else {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::erase_at(this_00,__n);
      pEVar1 = (type)aggr->aggregate_index;
      iVar2 = *(idx_t *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
                               ._M_cur + 0x10);
      local_88.table_index = (idx_t)pEVar1;
      local_88.column_index = lVar7 + __n;
      pmVar5 = ::std::__detail::
               _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_70,&local_88);
      lVar7 = lVar7 + 1;
      __n = __n - 1;
      pmVar5->table_index = (idx_t)pEVar1;
      pmVar5->column_index = iVar2;
      this_00 = local_78;
    }
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CommonAggregateOptimizer::ExtractCommonAggregates(LogicalAggregate &aggr) {
	expression_map_t<idx_t> aggregate_remap;
	idx_t total_erased = 0;
	for (idx_t i = 0; i < aggr.expressions.size(); i++) {
		idx_t original_index = i + total_erased;
		auto entry = aggregate_remap.find(*aggr.expressions[i]);
		if (entry == aggregate_remap.end()) {
			// aggregate does not exist yet: add it to the map
			aggregate_remap[*aggr.expressions[i]] = i;
			if (i != original_index) {
				// this aggregate is not erased, however an aggregate BEFORE it has been erased
				// so we need to remap this aggregate
				ColumnBinding original_binding(aggr.aggregate_index, original_index);
				ColumnBinding new_binding(aggr.aggregate_index, i);
				aggregate_map[original_binding] = new_binding;
			}
		} else {
			// aggregate already exists! we can remove this entry
			total_erased++;
			aggr.expressions.erase_at(i);
			i--;
			// we need to remap any references to this aggregate so they point to the other aggregate
			ColumnBinding original_binding(aggr.aggregate_index, original_index);
			ColumnBinding new_binding(aggr.aggregate_index, entry->second);
			aggregate_map[original_binding] = new_binding;
		}
	}
}